

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

Applicator * __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Substitution::
getApplicator(Substitution *this)

{
  long lVar1;
  GenMatcher *parent;
  Applicator *in_RDI;
  
  lVar1._0_4_ = (in_RDI->_cache)._deleted;
  lVar1._4_4_ = (in_RDI->_cache)._capacityIndex;
  if (lVar1 == 0) {
    parent = (GenMatcher *)GenMatcher::Applicator::operator_new(0x3ced44);
    GenMatcher::Applicator::Applicator(in_RDI,parent,(Renaming *)0x3ced60);
    *(GenMatcher **)&(in_RDI->_cache)._deleted = parent;
  }
  return *(Applicator **)&(in_RDI->_cache)._deleted;
}

Assistant:

Applicator* getApplicator()
  {
    if(!_applicator) {
      _applicator=new Applicator(_parent, _resultNormalizer);
    }
    return _applicator;
  }